

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O2

bool __thiscall cmCTestSVN::ExternalParser::ProcessLine(ExternalParser *this)

{
  bool bVar1;
  string sStack_38;
  
  bVar1 = cmsys::RegularExpression::find(&this->RegexExternal,&(this->super_LineParser).Line);
  if (bVar1) {
    cmsys::RegularExpression::match_abi_cxx11_(&sStack_38,&this->RegexExternal,1);
    DoPath(this,&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  return true;
}

Assistant:

bool ProcessLine()
    {
    if(this->RegexExternal.find(this->Line))
      {
      this->DoPath(this->RegexExternal.match(1));
      }
    return true;
    }